

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ostream *poVar5;
  int value;
  char *pcVar6;
  undefined7 in_register_00000039;
  int iVar7;
  string sStack_48;
  
  std::operator<<(os,"\'");
  iVar7 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0045bf5f_caseD_1:
    if (0x5e < (int)c - 0x20U) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      poVar5 = std::operator<<(os,"\\x");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<(poVar5,(uint)(byte)c);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
      bVar4 = true;
      goto LAB_0045bfea;
    }
    std::operator<<(os,c);
    goto LAB_0045bfe7;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar7 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar7 != 0x5c) goto switchD_0045bf5f_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  std::operator<<(os,pcVar6);
LAB_0045bfe7:
  bVar4 = false;
LAB_0045bfea:
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar5 = std::operator<<(os," (");
    std::ostream::operator<<(poVar5,(int)c);
    if (9 < (byte)c && !bVar4) {
      poVar5 = std::operator<<(os,", 0x");
      String::FormatHexInt_abi_cxx11_(&sStack_48,(String *)(ulong)(byte)c,value);
      std::operator<<(poVar5,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}